

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgga_x_scan.c
# Opt level: O3

void hyb_mgga_x_scan0_init(xc_func_type *p)

{
  void *pvVar1;
  
  pvVar1 = malloc(0x20);
  p->params = pvVar1;
  xc_mix_init(p,1,hyb_mgga_x_scan0_init::funcs_id,hyb_mgga_x_scan0_init::funcs_coef);
  xc_hyb_init_hybrid(p,0.0);
  return;
}

Assistant:

static void
hyb_mgga_x_scan0_init(xc_func_type *p)
{
  assert(p!=NULL && p->params == NULL);
  p->params = libxc_malloc(sizeof(mgga_x_scan_params));

  static int   funcs_id  [1] = {XC_MGGA_X_SCAN};
  static double funcs_coef[1] = {0.0}; /* set by ext_params */

  xc_mix_init(p, 1, funcs_id, funcs_coef);
  xc_hyb_init_hybrid(p, 0.0); /* set by ext_params */
}